

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

TokenType __thiscall wabt::WastParser::Peek(WastParser *this,size_t n)

{
  Location loc;
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  Token *value;
  Token cur;
  Token local_d8;
  char *local_98;
  size_type sStack_90;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_88;
  undefined8 uStack_80;
  Token local_70;
  
  if ((this->tokens_).size_ <= n) {
    do {
      WastLexer::GetToken(&local_d8,this->lexer_,this);
      value = &local_d8;
      if (local_d8.token_type_ == LparAnn) {
        if (this->options_[10] != (WastParseOptions)0x1) {
          local_88.offset = (size_t)local_d8.loc.field_1.field_1.offset;
          uStack_80 = local_d8.loc.field_1._8_8_;
          local_98 = local_d8.loc.filename.data_;
          sStack_90 = local_d8.loc.filename.size_;
          Token::to_string_abi_cxx11_((string *)&local_70,&local_d8);
          Error(this,0x1b238b,local_70.loc.filename.data_);
          if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_70.loc.filename.data_ !=
              &local_70.loc.field_1) {
            operator_delete(local_70.loc.filename.data_);
          }
          loc.filename.size_._0_4_ = (int)local_d8.loc.filename.size_;
          loc.filename.data_ = local_d8.loc.filename.data_;
          loc.filename.size_._4_4_ = (int)(local_d8.loc.filename.size_ >> 0x20);
          loc.field_1.field_0.line = local_d8.loc.field_1._0_4_;
          loc.field_1.field_0.first_column = local_d8.loc.field_1._4_4_;
          loc.field_1.field_0.last_column = (int)local_d8.loc.field_1._8_8_;
          loc.field_1._12_4_ = (int)((ulong)local_d8.loc.field_1._8_8_ >> 0x20);
          Token::Token(&local_70,loc,First);
          value = &local_70;
          goto LAB_0016bf42;
        }
        iVar3 = 1;
        uVar2 = local_d8._32_8_;
        do {
          local_d8._32_8_ = uVar2;
          WastLexer::GetToken(&local_70,this->lexer_,this);
          local_d8.loc.filename.data_ = local_70.loc.filename.data_;
          local_d8.loc.filename.size_ = local_70.loc.filename.size_;
          local_d8.loc.field_1.field_1.offset = local_70.loc.field_1.field_1.offset;
          local_d8.loc.field_1._8_8_ = local_70.loc.field_1._8_8_;
          uVar2._0_4_ = local_70.token_type_;
          uVar2._4_4_ = local_70._36_4_;
          local_d8.field_2.text_.data_ = local_70.field_2.text_.data_;
          local_d8.field_2.text_.size_ = local_70.field_2.text_.size_;
          local_d8.field_2.literal_.text.size_ = local_70.field_2.literal_.text.size_;
          local_d8.token_type_ = local_70.token_type_;
          local_d8._36_4_ = local_70._36_4_;
          uVar1 = local_d8._32_8_;
          local_d8.token_type_ = local_70.token_type_;
          if (local_d8.token_type_ == LparAnn) {
LAB_0016bea0:
            iVar3 = iVar3 + 1;
          }
          else if (local_d8.token_type_ == Rpar) {
            iVar3 = iVar3 + -1;
          }
          else if (local_d8.token_type_ == Lpar) goto LAB_0016bea0;
          local_d8._32_8_ = uVar1;
        } while (0 < iVar3);
      }
      else {
LAB_0016bf42:
        CircularArray<wabt::Token,_2UL>::push_back(&this->tokens_,value);
      }
    } while ((this->tokens_).size_ <= n);
  }
  return *(TokenType *)
          ((long)&(this->tokens_).contents_._M_elems[0].token_type_ +
          (ulong)(((int)n + (int)(this->tokens_).front_ & 1U) << 6));
}

Assistant:

TokenType WastParser::Peek(size_t n) {
  while (tokens_.size() <= n) {
    Token cur = lexer_->GetToken(this);
    if (cur.token_type() != TokenType::LparAnn) {
      tokens_.push_back(cur);
    } else {
      // Custom annotation. For now, discard until matching Rpar.
      if (!options_->features.annotations_enabled()) {
        Error(cur.loc, "annotations not enabled: %s", cur.to_string().c_str());
        tokens_.push_back(Token(cur.loc, TokenType::Invalid));
        continue;
      }
      int indent = 1;
      while (indent > 0) {
        cur = lexer_->GetToken(this);
        switch (cur.token_type()) {
          case TokenType::Lpar:
          case TokenType::LparAnn:
            indent++;
            break;

          case TokenType::Rpar:
            indent--;
            break;

          default:
            break;
        }
      }
    }
  }
  return tokens_.at(n).token_type();
}